

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O3

DdNode * Extra_bddEncodingBinary
                   (DdManager *dd,DdNode **pbFuncs,int nFuncs,DdNode **pbVars,int nVars)

{
  uint uVar1;
  int iVar2;
  DdNode *n;
  DdNode *pDVar3;
  ulong uVar4;
  DdNode *g;
  
  uVar1 = 0x1f;
  if (nFuncs - 1U != 0) {
    for (; nFuncs - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  iVar2 = (uVar1 ^ 0xffffffe0) + 0x21;
  if ((uint)nFuncs < 2) {
    iVar2 = nFuncs;
  }
  if (iVar2 <= nVars) {
    pDVar3 = (DdNode *)((ulong)dd->one ^ 1);
    Cudd_Ref(pDVar3);
    if (0 < nFuncs) {
      uVar4 = 0;
      g = pDVar3;
      do {
        pDVar3 = Extra_bddBitsToCube(dd,(int)uVar4,nVars,pbVars,1);
        Cudd_Ref(pDVar3);
        n = Cudd_bddAnd(dd,pDVar3,pbFuncs[uVar4]);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar3);
        pDVar3 = Cudd_bddOr(dd,n,g);
        Cudd_Ref(pDVar3);
        Cudd_RecursiveDeref(dd,g);
        Cudd_RecursiveDeref(dd,n);
        uVar4 = uVar4 + 1;
        g = pDVar3;
      } while ((uint)nFuncs != uVar4);
    }
    Cudd_Deref(pDVar3);
    return pDVar3;
  }
  __assert_fail("nVars >= Abc_Base2Log(nFuncs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddCas.c"
                ,0x95,"DdNode *Extra_bddEncodingBinary(DdManager *, DdNode **, int, DdNode **, int)"
               );
}

Assistant:

DdNode * 
Extra_bddEncodingBinary( 
  DdManager * dd, 
  DdNode ** pbFuncs,    // pbFuncs is the array of columns to be encoded
  int nFuncs,           // nFuncs is the number of columns in the array
  DdNode ** pbVars,     // pbVars is the array of variables to use for the codes
  int nVars )           // nVars is the column multiplicity, [log2(nFuncs)]
{
    int i;
    DdNode * bResult;
    DdNode * bCube, * bTemp, * bProd;

    assert( nVars >= Abc_Base2Log(nFuncs) );

    bResult = b0;   Cudd_Ref( bResult );
    for ( i = 0; i < nFuncs; i++ )
    {
        bCube   = Extra_bddBitsToCube( dd, i, nVars, pbVars, 1 );   Cudd_Ref( bCube );
        bProd   = Cudd_bddAnd( dd, bCube, pbFuncs[i] );         Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bCube );

        bResult = Cudd_bddOr( dd, bProd, bTemp = bResult );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

    Cudd_Deref( bResult );
    return bResult;
}